

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

size_t __thiscall
google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelfLong(UnknownFieldSet *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  int iVar2;
  pointer pUVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  
  pvVar1 = this->fields_;
  if (pvVar1 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    sVar6 = 0;
  }
  else {
    pUVar3 = (pvVar1->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(pvVar1->
                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3;
    sVar6 = lVar5 + 0x18;
    if (lVar5 != 0) {
      lVar5 = 8;
      uVar7 = 0;
      do {
        iVar2 = *(int *)((long)pUVar3 + lVar5 + -4);
        if (iVar2 == 4) {
          iVar2 = SpaceUsedExcludingSelf(*(UnknownFieldSet **)((long)&pUVar3->number_ + lVar5));
          sVar6 = sVar6 + (long)iVar2 + 8;
        }
        else if (iVar2 == 3) {
          sVar4 = internal::StringSpaceUsedExcludingSelfLong
                            (*(string **)((long)&pUVar3->number_ + lVar5));
          sVar6 = sVar6 + sVar4 + 0x20;
        }
        uVar7 = uVar7 + 1;
        pUVar3 = (this->fields_->
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x10;
      } while (uVar7 < (ulong)((long)(this->fields_->
                                     super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3 >> 4
                              ));
    }
  }
  return sVar6;
}

Assistant:

size_t UnknownFieldSet::SpaceUsedExcludingSelfLong() const {
  if (fields_ == NULL) return 0;

  size_t total_size = sizeof(*fields_) + sizeof(UnknownField) * fields_->size();

  for (int i = 0; i < fields_->size(); i++) {
    const UnknownField& field = (*fields_)[i];
    switch (field.type()) {
      case UnknownField::TYPE_LENGTH_DELIMITED:
        total_size += sizeof(*field.data_.length_delimited_.string_value_) +
                      internal::StringSpaceUsedExcludingSelfLong(
                          *field.data_.length_delimited_.string_value_);
        break;
      case UnknownField::TYPE_GROUP:
        total_size += field.data_.group_->SpaceUsedLong();
        break;
      default:
        break;
    }
  }
  return total_size;
}